

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

VectorSet<const_llvm::Value_*> * __thiscall
dg::vr::ValueRelations::getValsByPtr(ValueRelations *this,V from)

{
  HandlePtr pBVar1;
  ValueRelations *in_RSI;
  Handle in_RDI;
  HandlePtr toH;
  HandlePtr mH;
  Handle in_stack_ffffffffffffffb8;
  Handle h;
  V in_stack_ffffffffffffffd8;
  ValueRelations *in_stack_ffffffffffffffe0;
  
  h = in_RDI;
  pBVar1 = maybeGet(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pBVar1 == (HandlePtr)0x0) {
    memset(in_RDI,0,0x18);
    VectorSet<const_llvm::Value_*>::VectorSet((VectorSet<const_llvm::Value_*> *)0x209adc);
  }
  else {
    pBVar1 = getHandleByPtr(in_stack_ffffffffffffffb8);
    if (pBVar1 == (HandlePtr)0x0) {
      memset(in_RDI,0,0x18);
      VectorSet<const_llvm::Value_*>::VectorSet((VectorSet<const_llvm::Value_*> *)0x209b10);
    }
    else {
      getEqual(in_RSI,h);
      VectorSet<const_llvm::Value_*>::VectorSet
                ((VectorSet<const_llvm::Value_*> *)in_RDI,
                 (VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffffb8);
    }
  }
  return (VectorSet<const_llvm::Value_*> *)h;
}

Assistant:

VectorSet<ValueRelations::V> ValueRelations::getValsByPtr(V from) const {
    HandlePtr mH = maybeGet(from);
    if (!mH)
        return {};
    HandlePtr toH = getHandleByPtr(*mH);
    if (!toH)
        return {};
    return getEqual(*toH);
}